

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

PropertyString * __thiscall
Js::ScriptContext::GetPropertyString2(ScriptContext *this,char16 ch1,char16 ch2)

{
  PropertyStringMap *pPVar1;
  PropertyString *pPVar2;
  
  if ((ushort)(ch2 + L'ﾅ') < 0xffb5 || (ushort)(ch1 + L'ﾅ') < 0xffb5) {
    return (PropertyString *)0x0;
  }
  pPVar1 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings
           [(ushort)ch1 - 0x30].ptr;
  if (pPVar1 == (PropertyStringMap *)0x0) {
    pPVar2 = (PropertyString *)0x0;
  }
  else {
    pPVar2 = pPVar1->strLen2[(ushort)ch2 - 0x30].ptr;
  }
  return pPVar2;
}

Assistant:

PropertyString* ScriptContext::GetPropertyString2(char16 ch1, char16 ch2)
    {
        if (ch1 < '0' || ch1 > 'z' || ch2 < '0' || ch2 > 'z')
        {
            return NULL;
        }
        const uint i = PropertyStringMap::PStrMapIndex(ch1);
        if (this->Cache()->propertyStrings[i] == NULL)
        {
            return NULL;
        }
        const uint j = PropertyStringMap::PStrMapIndex(ch2);
        return this->Cache()->propertyStrings[i]->strLen2[j];
    }